

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O3

bool __thiscall Parse::SMTLIB2::parseAsBuiltinTermSymbol(SMTLIB2 *this,string *id,LExpr *exp)

{
  Stack<Parse::SMTLIB2::ParseResult> *pSVar1;
  ParseResult **ppPVar2;
  pointer pcVar3;
  Signature *pSVar4;
  bool bVar5;
  TermSymbol ts;
  Interpretation IVar6;
  uint uVar7;
  anon_union_8_2_43a9448f_for_ParseResult_3 aVar8;
  anon_union_8_2_43a9448f_for_ParseResult_3 aVar9;
  TermList TVar10;
  OperatorType *pOVar11;
  anon_union_8_2_43a9448f_for_ParseResult_3 aVar12;
  anon_union_8_2_43a9448f_for_ParseResult_3 aVar13;
  ParseResult *pPVar14;
  TermList TVar15;
  Formula *pFVar16;
  Literal *pLVar17;
  Term *pTVar18;
  uint64_t *puVar19;
  anon_union_8_2_43a9448f_for_ParseResult_3 *paVar20;
  size_type *psVar21;
  size_type sVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  TermList in_R8;
  void **head;
  ParseResult res;
  TermList arraySortIdx;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_3c8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_398;
  LExpr *local_388;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_380;
  char local_378;
  anon_union_8_2_43a9448f_for_ParseResult_3 *local_370;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_360 [2];
  Term *local_350;
  Stack<Parse::SMTLIB2::ParseResult> *local_348;
  uint64_t local_340;
  bool local_338;
  char *local_330;
  size_type local_328;
  char local_320;
  undefined7 uStack_31f;
  undefined8 uStack_318;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_310;
  uint64_t local_308;
  bool local_300;
  char *local_2f8;
  size_type local_2f0;
  char local_2e8;
  undefined7 uStack_2e7;
  undefined8 uStack_2e0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_2d8;
  uint64_t local_2d0;
  bool local_2c8;
  char *local_2c0;
  size_type local_2b8;
  char local_2b0;
  undefined7 uStack_2af;
  undefined8 uStack_2a8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_2a0;
  uint64_t local_298;
  bool local_290;
  char *local_288;
  size_type local_280;
  char local_278;
  undefined7 uStack_277;
  undefined8 uStack_270;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_268;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_260;
  bool local_258;
  char *local_250;
  size_type local_248;
  char local_240;
  undefined7 uStack_23f;
  undefined8 uStack_238;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_230;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_228;
  bool local_220;
  char *local_218;
  size_type local_210;
  char local_208;
  undefined7 uStack_207;
  undefined8 uStack_200;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_1f8;
  uint64_t local_1f0;
  bool local_1e8;
  char *local_1e0;
  size_type local_1d8;
  char local_1d0;
  undefined7 uStack_1cf;
  undefined8 uStack_1c8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_1c0;
  uint64_t local_1b8;
  bool local_1b0;
  char *local_1a8;
  size_type local_1a0;
  char local_198;
  undefined7 uStack_197;
  undefined8 uStack_190;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_188;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_180;
  bool local_178;
  char *local_170;
  size_type local_168;
  char local_160;
  undefined7 uStack_15f;
  undefined8 uStack_158;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_150;
  uint64_t local_148;
  bool local_140;
  char *local_138;
  size_type local_130;
  char local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_118;
  uint64_t local_110;
  bool local_108;
  char *local_100;
  size_type local_f8;
  char local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_e0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_d8;
  bool local_d0;
  char *local_c8;
  size_type local_c0;
  char local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_a8;
  uint64_t local_a0;
  bool local_98;
  size_type *local_90;
  uint64_t local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_70;
  uint64_t local_68;
  bool local_60;
  size_type *local_58;
  uint64_t local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_38;
  
  ts = getBuiltInTermSymbol(id);
  bVar5 = false;
  local_388 = exp;
  switch(ts) {
  case TS_MULTIPLY:
  case TS_PLUS:
  case TS_MINUS:
  case TS_DIVIDE:
  case TS_DIV:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    (this->_results)._cursor = pPVar14 + -1;
    local_3c0.trm._content._0_1_ = pPVar14[-1].formula;
    local_3c8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].sort._content;
    local_3b8._M_allocated_capacity = (size_type)pPVar14[-1].label._M_dataplus._M_p;
    paVar23 = &pPVar14[-1].label.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity == paVar23) {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_3a8._8_8_ = *(undefined8 *)((long)&pPVar14[-1].label.field_2 + 8);
      local_3b8._M_allocated_capacity = (size_type)&local_3a8;
    }
    else {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
    }
    local_3b8._8_8_ = pPVar14[-1].label._M_string_length;
    pPVar14[-1].label._M_dataplus._M_p = (pointer)paVar23;
    pPVar14[-1].label._M_string_length = 0;
    pPVar14[-1].label.field_2._M_local_buf[0] = '\0';
    local_398 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].field_3.trm._content;
    pPVar14 = (this->_results)._cursor;
    pcVar3 = (pPVar14->label)._M_dataplus._M_p;
    paVar23 = &(pPVar14->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar23) {
      operator_delete(pcVar3,paVar23->_M_allocated_capacity + 1);
    }
    aVar8 = local_3c8;
    aVar9 = local_398;
    if (local_3c0._0_1_ == '\x01') {
      aVar9.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar8.trm = Kernel::AtomicSort::boolSort();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    local_348 = &this->_results;
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
      if (ts != TS_MINUS) {
        local_3c8.frm = (Formula *)&local_3b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
        complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
      }
      IVar6 = getUnaryMinusInterpretation(this,aVar8.trm);
      pSVar4 = DAT_00b521b0;
      pOVar11 = Kernel::Theory::getNonpolymorphicOperatorType(IVar6);
      uVar7 = Kernel::Signature::getInterpretingSymbol(pSVar4,IVar6,pOVar11);
      local_1f8.frm = (Formula *)Kernel::Term::create1(uVar7,aVar9.trm);
      local_220 = false;
      local_210 = 0;
      local_208 = '\0';
      pPVar14 = (this->_results)._cursor;
      local_228 = aVar8;
      local_218 = &local_208;
      if (pPVar14 == (this->_results)._end) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(local_348);
        pPVar14 = (this->_results)._cursor;
      }
      pPVar14->formula = local_220;
      (pPVar14->sort)._content = (uint64_t)local_228;
      paVar23 = &(pPVar14->label).field_2;
      (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
      if (local_218 == &local_208) {
        paVar23->_M_allocated_capacity = CONCAT71(uStack_207,local_208);
        *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_200;
      }
      else {
        (pPVar14->label)._M_dataplus._M_p = local_218;
        (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_207,local_208);
      }
      (pPVar14->label)._M_string_length = local_210;
      local_e0 = local_1f8;
    }
    else {
      IVar6 = getTermSymbolInterpretation(this,ts,aVar8.trm);
      pSVar4 = DAT_00b521b0;
      pOVar11 = Kernel::Theory::getNonpolymorphicOperatorType(IVar6);
      uVar7 = Kernel::Signature::getInterpretingSymbol(pSVar4,IVar6,pOVar11);
      pPVar14 = (this->_results)._cursor;
      (this->_results)._cursor = pPVar14 + -1;
      local_3c0.trm._content._0_1_ = pPVar14[-1].formula;
      local_3c8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].sort._content;
      local_3b8._M_allocated_capacity = (size_type)pPVar14[-1].label._M_dataplus._M_p;
      paVar23 = &pPVar14[-1].label.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_allocated_capacity == paVar23) {
        local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
        local_3a8._8_8_ = *(undefined8 *)((long)&pPVar14[-1].label.field_2 + 8);
        local_3b8._M_allocated_capacity = (size_type)&local_3a8;
      }
      else {
        local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      }
      local_3b8._8_8_ = pPVar14[-1].label._M_string_length;
      pPVar14[-1].label._M_dataplus._M_p = (pointer)paVar23;
      pPVar14[-1].label._M_string_length = 0;
      pPVar14[-1].label.field_2._M_local_buf[0] = '\0';
      local_398 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].field_3.frm;
      pPVar14 = (this->_results)._cursor;
      pcVar3 = (pPVar14->label)._M_dataplus._M_p;
      paVar23 = &(pPVar14->label).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar23) {
        operator_delete(pcVar3,paVar23->_M_allocated_capacity + 1);
      }
      aVar12 = local_398;
      aVar13 = local_3c8;
      if (local_3c0._0_1_ == '\x01') {
        aVar12.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
        aVar13.trm = Kernel::AtomicSort::boolSort();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_allocated_capacity != &local_3a8) {
        operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1)
        ;
      }
      if (aVar13.frm != aVar8.frm) {
        local_3c8.frm = (Formula *)&local_3b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
        complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
      }
      while( true ) {
        aVar9.frm = (Formula *)Kernel::Term::create2(uVar7,aVar9.trm,aVar12.trm);
        pPVar14 = (this->_results)._cursor;
        if ((pPVar14 == (this->_results)._stack) ||
           ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
            (pPVar14[-1].field_3.frm == (Formula *)0x0)))) break;
        (this->_results)._cursor = pPVar14 + -1;
        local_3c0.trm._content._0_1_ = pPVar14[-1].formula;
        local_3c8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].sort._content;
        local_3b8._M_allocated_capacity = (size_type)pPVar14[-1].label._M_dataplus._M_p;
        paVar23 = &pPVar14[-1].label.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_allocated_capacity == paVar23) {
          local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
          local_3a8._8_8_ = *(undefined8 *)((long)&pPVar14[-1].label.field_2 + 8);
          local_3b8._M_allocated_capacity = (size_type)&local_3a8;
        }
        else {
          local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
        }
        local_3b8._8_8_ = pPVar14[-1].label._M_string_length;
        pPVar14[-1].label._M_dataplus._M_p = (pointer)paVar23;
        pPVar14[-1].label._M_string_length = 0;
        pPVar14[-1].label.field_2._M_local_buf[0] = '\0';
        local_398 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].field_3.frm;
        pPVar14 = (this->_results)._cursor;
        pcVar3 = (pPVar14->label)._M_dataplus._M_p;
        paVar23 = &(pPVar14->label).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar23) {
          operator_delete(pcVar3,paVar23->_M_allocated_capacity + 1);
        }
        aVar12 = local_398;
        aVar13 = local_3c8;
        if (local_3c0._0_1_ == '\x01') {
          aVar12.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
          aVar13.trm = Kernel::AtomicSort::boolSort();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_allocated_capacity != &local_3a8) {
          operator_delete((void *)local_3b8._M_allocated_capacity,
                          local_3a8._M_allocated_capacity + 1);
        }
        if (aVar13.frm != aVar8.frm) {
          local_3c8.frm = (Formula *)&local_3b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","")
          ;
          complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
        }
      }
      local_258 = false;
      local_248 = 0;
      local_240 = '\0';
      local_260 = aVar8;
      local_250 = &local_240;
      local_230.frm = aVar9.frm;
      if (pPVar14 == (this->_results)._end) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(local_348);
        pPVar14 = (this->_results)._cursor;
      }
      pPVar14->formula = local_258;
      (pPVar14->sort)._content = (uint64_t)local_260;
      paVar23 = &(pPVar14->label).field_2;
      (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
      if (local_250 == &local_240) {
        paVar23->_M_allocated_capacity = CONCAT71(uStack_23f,local_240);
        *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_238;
      }
      else {
        (pPVar14->label)._M_dataplus._M_p = local_250;
        (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_23f,local_240);
      }
      (pPVar14->label)._M_string_length = local_248;
      local_e0 = local_230;
    }
    break;
  case TS_ARRAY:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,exp);
    }
    (this->_results)._cursor = pPVar14 + -1;
    local_3c0.trm._content._0_1_ = pPVar14[-1].formula;
    local_3c8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].sort._content;
    local_3b8._M_allocated_capacity = (size_type)pPVar14[-1].label._M_dataplus._M_p;
    paVar23 = &pPVar14[-1].label.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity == paVar23) {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_3a8._8_8_ = *(undefined8 *)((long)&pPVar14[-1].label.field_2 + 8);
      local_3b8._M_allocated_capacity = (size_type)&local_3a8;
    }
    else {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
    }
    local_3b8._8_8_ = pPVar14[-1].label._M_string_length;
    pPVar14[-1].label._M_dataplus._M_p = (pointer)paVar23;
    pPVar14[-1].label._M_string_length = 0;
    pPVar14[-1].label.field_2._M_local_buf[0] = '\0';
    local_398 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].field_3.frm;
    pPVar14 = (this->_results)._cursor;
    pcVar3 = (pPVar14->label)._M_dataplus._M_p;
    paVar23 = &(pPVar14->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar23) {
      operator_delete(pcVar3,paVar23->_M_allocated_capacity + 1);
    }
    aVar8 = local_398;
    if (local_3c0._0_1_ == '\x01') {
      aVar8.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      Kernel::AtomicSort::boolSort();
    }
    Kernel::AtomicSort::superSort();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,exp);
    }
    (this->_results)._cursor = pPVar14 + -1;
    local_3c0.trm._content._0_1_ = pPVar14[-1].formula;
    local_3c8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].sort._content;
    local_3b8._M_allocated_capacity = (size_type)pPVar14[-1].label._M_dataplus._M_p;
    paVar23 = &pPVar14[-1].label.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity == paVar23) {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_3a8._8_8_ = *(undefined8 *)((long)&pPVar14[-1].label.field_2 + 8);
      local_3b8._M_allocated_capacity = (size_type)&local_3a8;
    }
    else {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
    }
    local_3b8._8_8_ = pPVar14[-1].label._M_string_length;
    pPVar14[-1].label._M_dataplus._M_p = (pointer)paVar23;
    pPVar14[-1].label._M_string_length = 0;
    pPVar14[-1].label.field_2._M_local_buf[0] = '\0';
    local_398 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].field_3.frm;
    pPVar14 = (this->_results)._cursor;
    pcVar3 = (pPVar14->label)._M_dataplus._M_p;
    paVar23 = &(pPVar14->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar23) {
      operator_delete(pcVar3,paVar23->_M_allocated_capacity + 1);
    }
    aVar9 = local_398;
    if (local_3c0._0_1_ == '\x01') {
      aVar9.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      Kernel::AtomicSort::boolSort();
    }
    Kernel::AtomicSort::superSort();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    TVar10 = Kernel::AtomicSort::superSort();
    local_268.trm = Kernel::AtomicSort::arraySort(aVar8.trm,aVar9.trm);
    local_290 = false;
    local_280 = 0;
    local_278 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_298 = TVar10._content;
    local_288 = &local_278;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_290;
    (pPVar14->sort)._content = local_298;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_288 == &local_278) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_277,local_278);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_270;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_288;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_277,local_278);
    }
    (pPVar14->label)._M_string_length = local_280;
    local_e0 = local_268;
    break;
  case TS_BOOL:
    TVar10 = Kernel::AtomicSort::superSort();
    local_2a0.trm = Kernel::AtomicSort::boolSort();
    local_2c8 = false;
    local_2b8 = 0;
    local_2b0 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_2d0 = TVar10._content;
    local_2c0 = &local_2b0;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_2c8;
    (pPVar14->sort)._content = local_2d0;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_2c0 == &local_2b0) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_2af,local_2b0);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_2a8;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_2c0;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_2af,local_2b0);
    }
    (pPVar14->label)._M_string_length = local_2b8;
    local_e0 = local_2a0;
    break;
  case TS_INT:
    TVar10 = Kernel::AtomicSort::superSort();
    local_2d8.trm = Kernel::AtomicSort::intSort();
    local_300 = false;
    local_2f0 = 0;
    local_2e8 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_308 = TVar10._content;
    local_2f8 = &local_2e8;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_300;
    (pPVar14->sort)._content = local_308;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_2f8 == &local_2e8) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_2e7,local_2e8);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_2e0;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_2f8;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_2e7,local_2e8);
    }
    (pPVar14->label)._M_string_length = local_2f0;
    local_e0 = local_2d8;
    break;
  case TS_REAL:
    TVar10 = Kernel::AtomicSort::superSort();
    local_310.trm = Kernel::AtomicSort::realSort();
    local_338 = false;
    local_328 = 0;
    local_320 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_340 = TVar10._content;
    local_330 = &local_320;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_338;
    (pPVar14->sort)._content = local_340;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_330 == &local_320) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_31f,local_320);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_318;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_330;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_31f,local_320);
    }
    (pPVar14->label)._M_string_length = local_328;
    local_e0 = local_310;
    break;
  case TS_ABS:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_00633f8c:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,&this->_results);
    aVar8 = local_398;
    aVar9 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar8.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar9.trm = Kernel::AtomicSort::boolSort();
    }
    TVar10 = Kernel::AtomicSort::intSort();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    pSVar4 = DAT_00b521b0;
    if (aVar9.frm != (Formula *)TVar10._content) goto LAB_00633f8c;
    pOVar11 = Kernel::Theory::getNonpolymorphicOperatorType(INT_ABS);
    uVar7 = Kernel::Signature::getInterpretingSymbol(pSVar4,INT_ABS,pOVar11);
    aVar8.frm = (Formula *)Kernel::Term::create1(uVar7,aVar8.trm);
    local_1b8 = (uint64_t)Kernel::AtomicSort::intSort();
    local_1b0 = false;
    local_1a0 = 0;
    local_198 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_1a8 = &local_198;
    local_188.frm = aVar8.frm;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_1b0;
    (pPVar14->sort)._content = local_1b8;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_1a8 == &local_198) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_197,local_198);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_190;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_1a8;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_197,local_198);
    }
    (pPVar14->label)._M_string_length = local_1a0;
    local_e0 = local_188;
    break;
  case TS_ITE:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_00633eeb:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,pSVar1);
    bVar5 = ParseResult::asFormula((ParseResult *)&local_3c8.trm,&local_380.frm);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    if (!bVar5) goto LAB_00633eeb;
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    (this->_results)._cursor = pPVar14 + -1;
    local_3c0.trm._content._0_1_ = pPVar14[-1].formula;
    local_3c8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].sort._content;
    local_3b8._M_allocated_capacity = (size_type)pPVar14[-1].label._M_dataplus._M_p;
    paVar23 = &pPVar14[-1].label.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity == paVar23) {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_3a8._8_8_ = *(undefined8 *)((long)&pPVar14[-1].label.field_2 + 8);
      local_3b8._M_allocated_capacity = (size_type)&local_3a8;
    }
    else {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
    }
    local_3b8._8_8_ = pPVar14[-1].label._M_string_length;
    pPVar14[-1].label._M_dataplus._M_p = (pointer)paVar23;
    pPVar14[-1].label._M_string_length = 0;
    pPVar14[-1].label.field_2._M_local_buf[0] = '\0';
    local_398 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].field_3.frm;
    pPVar14 = (this->_results)._cursor;
    pcVar3 = (pPVar14->label)._M_dataplus._M_p;
    paVar23 = &(pPVar14->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar23) {
      operator_delete(pcVar3,paVar23->_M_allocated_capacity + 1);
    }
    aVar8 = local_398;
    aVar9 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar8.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar9.trm = Kernel::AtomicSort::boolSort();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_00634062:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,pSVar1);
    aVar12 = local_398;
    aVar13 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar12.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar13.trm = Kernel::AtomicSort::boolSort();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    if (aVar13.frm != aVar9.frm) goto LAB_00634062;
    local_a8.frm = (Formula *)Kernel::Term::createITE(local_380.frm,aVar8.trm,aVar12.trm,aVar9.trm);
    local_d0 = false;
    local_c0 = 0;
    local_b8 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_d8 = aVar9;
    local_c8 = &local_b8;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_d0;
    (pPVar14->sort)._content = (uint64_t)local_d8;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_c8 == &local_b8) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_b0;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_c8;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_b7,local_b8);
    }
    (pPVar14->label)._M_string_length = local_c0;
    local_e0 = local_a8;
    break;
  default:
    goto switchD_00632401_caseD_b;
  case TS_MOD:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_00633fc2:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,exp);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,pSVar1);
    aVar8 = local_398;
    aVar9 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar8.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar9.trm = Kernel::AtomicSort::boolSort();
    }
    TVar15 = Kernel::AtomicSort::intSort();
    bVar5 = true;
    TVar10._content = 2;
    if (((aVar9.frm == (Formula *)TVar15._content) &&
        (pPVar14 = (this->_results)._cursor, pPVar14 != (this->_results)._stack)) &&
       (((~(uint)pPVar14[-1].sort._content & 3) != 0 ||
        ((pPVar14[-1].formula != true || (pPVar14[-1].field_3.frm != (Formula *)0x0)))))) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_380.trm,pSVar1);
      TVar10._content = (uint64_t)local_350;
      aVar9 = local_380;
      if (local_378 == '\x01') {
        TVar10._content = (uint64_t)Kernel::Term::createFormula((Formula *)local_350);
        aVar9.trm = Kernel::AtomicSort::boolSort();
      }
      TVar15 = Kernel::AtomicSort::intSort();
      bVar5 = aVar9.frm != (Formula *)TVar15._content;
      if (local_370 != local_360) {
        operator_delete(local_370,(ulong)((long)&(local_360[0].frm)->_connective + 1));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    pSVar4 = DAT_00b521b0;
    if (bVar5) goto LAB_00633fc2;
    pOVar11 = Kernel::Theory::getNonpolymorphicOperatorType(INT_REMAINDER_E);
    uVar7 = Kernel::Signature::getInterpretingSymbol(pSVar4,INT_REMAINDER_E,pOVar11);
    aVar8.frm = (Formula *)Kernel::Term::create2(uVar7,aVar8.trm,TVar10);
    local_1f0 = (uint64_t)Kernel::AtomicSort::intSort();
    local_1e8 = false;
    local_1d8 = 0;
    local_1d0 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_1e0 = &local_1d0;
    local_1c0.frm = aVar8.frm;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_1e8;
    (pPVar14->sort)._content = local_1f0;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_1e0 == &local_1d0) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_1cf,local_1d0);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_1c8;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_1e0;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_1cf,local_1d0);
    }
    (pPVar14->label)._M_string_length = local_1d8;
    local_e0 = local_1c0;
    break;
  case TS_SELECT:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    (this->_results)._cursor = pPVar14 + -1;
    local_3c0.trm._content._0_1_ = pPVar14[-1].formula;
    local_3c8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].sort._content;
    local_3b8._M_allocated_capacity = (size_type)pPVar14[-1].label._M_dataplus._M_p;
    paVar23 = &pPVar14[-1].label.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity == paVar23) {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_3a8._8_8_ = *(undefined8 *)((long)&pPVar14[-1].label.field_2 + 8);
      local_3b8._M_allocated_capacity = (size_type)&local_3a8;
    }
    else {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
    }
    local_3b8._8_8_ = pPVar14[-1].label._M_string_length;
    pPVar14[-1].label._M_dataplus._M_p = (pointer)paVar23;
    pPVar14[-1].label._M_string_length = 0;
    pPVar14[-1].label.field_2._M_local_buf[0] = '\0';
    local_398 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].field_3.frm;
    pPVar14 = (this->_results)._cursor;
    pcVar3 = (pPVar14->label)._M_dataplus._M_p;
    paVar23 = &(pPVar14->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar23) {
      operator_delete(pcVar3,paVar23->_M_allocated_capacity + 1);
    }
    local_380 = local_3c8;
    aVar8 = local_398;
    if (local_3c0._0_1_ == '\x01') {
      aVar8.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      local_380.trm = Kernel::AtomicSort::boolSort();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    bVar5 = Kernel::TermList::isArraySort(&local_380.trm);
    if (!bVar5) {
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_0063402d:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,pSVar1);
    aVar9 = local_398;
    aVar12 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar9.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar12.trm = Kernel::AtomicSort::boolSort();
    }
    TVar10 = Kernel::SortHelper::getIndexSort(local_380.trm);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    if (aVar12.frm != (Formula *)TVar10._content) goto LAB_0063402d;
    TVar10 = Kernel::SortHelper::getInnerSort(local_380.trm);
    TVar15 = Kernel::AtomicSort::boolSort();
    if (TVar10._content == TVar15._content) {
      pOVar11 = Kernel::Theory::getArrayOperatorType(local_380.trm,ARRAY_BOOL_SELECT);
      uVar7 = Kernel::Signature::getInterpretingSymbol(DAT_00b521b0,ARRAY_BOOL_SELECT,pOVar11);
      pFVar16 = (Formula *)
                Lib::FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      pLVar17 = Kernel::Literal::create2
                          ((Literal *)(ulong)uVar7,1,SUB81(aVar8.trm._content,0),aVar9.trm,in_R8);
      pFVar16->_connective = LITERAL;
      (pFVar16->_label)._M_dataplus._M_p = (pointer)&(pFVar16->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar16->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Literal **)(pFVar16 + 1) = pLVar17;
      local_68 = (uint64_t)Kernel::AtomicSort::boolSort();
      psVar21 = (size_type *)&local_48;
      local_60 = true;
      local_58 = psVar21;
      local_50 = 0;
      local_48 = 0;
      local_38.frm = pFVar16;
      pPVar14 = (this->_results)._cursor;
      if (pPVar14 == (this->_results)._end) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
        pPVar14 = (this->_results)._cursor;
      }
      puVar19 = &local_50;
      paVar20 = &local_38;
      pPVar14->formula = local_60;
      (pPVar14->sort)._content = local_68;
      paVar23 = &(pPVar14->label).field_2;
      (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
      if (local_58 != psVar21) {
        (pPVar14->label)._M_dataplus._M_p = (pointer)local_58;
        sVar22 = CONCAT71(uStack_47,local_48);
        goto LAB_0063389e;
      }
LAB_00633cde:
      sVar22 = psVar21[1];
      paVar23->_M_allocated_capacity = *psVar21;
      *(size_type *)((long)paVar23 + 8) = sVar22;
    }
    else {
      pOVar11 = Kernel::Theory::getArrayOperatorType(local_380.trm,ARRAY_SELECT);
      uVar7 = Kernel::Signature::getInterpretingSymbol(DAT_00b521b0,ARRAY_SELECT,pOVar11);
      pTVar18 = Kernel::Term::create2(uVar7,aVar8.trm,aVar9.trm);
      local_a0 = (uint64_t)Kernel::SortHelper::getInnerSort(local_380.trm);
      psVar21 = (size_type *)&local_80;
      local_98 = false;
      local_88 = 0;
      local_80 = 0;
      local_70.frm = (Formula *)pTVar18;
      pPVar14 = (this->_results)._cursor;
      local_90 = psVar21;
      if (pPVar14 == (this->_results)._end) {
        Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
        pPVar14 = (this->_results)._cursor;
      }
      puVar19 = &local_88;
      paVar20 = &local_70;
      pPVar14->formula = local_98;
      (pPVar14->sort)._content = local_a0;
      paVar23 = &(pPVar14->label).field_2;
      (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
      if (local_90 == psVar21) goto LAB_00633cde;
      (pPVar14->label)._M_dataplus._M_p = (pointer)local_90;
      sVar22 = CONCAT71(uStack_7f,local_80);
LAB_0063389e:
      (pPVar14->label).field_2._M_allocated_capacity = sVar22;
    }
    (pPVar14->label)._M_string_length = *puVar19;
    local_e0 = *paVar20;
    break;
  case TS_STORE:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    (this->_results)._cursor = pPVar14 + -1;
    local_3c0.trm._content._0_1_ = pPVar14[-1].formula;
    local_3c8 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].sort._content;
    local_3b8._M_allocated_capacity = (size_type)pPVar14[-1].label._M_dataplus._M_p;
    paVar23 = &pPVar14[-1].label.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity == paVar23) {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_3a8._8_8_ = *(undefined8 *)((long)&pPVar14[-1].label.field_2 + 8);
      local_3b8._M_allocated_capacity = (size_type)&local_3a8;
    }
    else {
      local_3a8._M_allocated_capacity = paVar23->_M_allocated_capacity;
    }
    local_3b8._8_8_ = pPVar14[-1].label._M_string_length;
    pPVar14[-1].label._M_dataplus._M_p = (pointer)paVar23;
    pPVar14[-1].label._M_string_length = 0;
    pPVar14[-1].label.field_2._M_local_buf[0] = '\0';
    local_398 = (anon_union_8_2_43a9448f_for_ParseResult_3)pPVar14[-1].field_3.frm;
    pPVar14 = (this->_results)._cursor;
    pcVar3 = (pPVar14->label)._M_dataplus._M_p;
    paVar23 = &(pPVar14->label).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar23) {
      operator_delete(pcVar3,paVar23->_M_allocated_capacity + 1);
    }
    local_380 = local_3c8;
    aVar8 = local_398;
    if (local_3c0._0_1_ == '\x01') {
      aVar8.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      local_380.trm = Kernel::AtomicSort::boolSort();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    bVar5 = Kernel::TermList::isArraySort(&local_380.trm);
    if (!bVar5) {
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_00633ff8:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    pSVar1 = &this->_results;
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,pSVar1);
    aVar9 = local_398;
    aVar12 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar9.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar12.trm = Kernel::AtomicSort::boolSort();
    }
    TVar10 = Kernel::SortHelper::getIndexSort(local_380.trm);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    if (aVar12.frm != (Formula *)TVar10._content) goto LAB_00633ff8;
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_00634097:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,local_388);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,pSVar1);
    aVar12 = local_398;
    aVar13 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar12.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar13.trm = Kernel::AtomicSort::boolSort();
    }
    TVar10 = Kernel::SortHelper::getInnerSort(local_380.trm);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    if (aVar13.frm != (Formula *)TVar10._content) goto LAB_00634097;
    pOVar11 = Kernel::Theory::getArrayOperatorType(local_380.trm,ARRAY_STORE);
    uVar7 = Kernel::Signature::getInterpretingSymbol(DAT_00b521b0,ARRAY_STORE,pOVar11);
    local_3c8 = aVar8;
    local_3c0 = aVar9;
    local_3b8._M_allocated_capacity = (size_type)aVar12;
    local_150.frm = (Formula *)Kernel::Term::create(uVar7,3,&local_3c8.trm);
    local_180.frm = local_380.frm;
    local_178 = false;
    local_168 = 0;
    local_160 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_170 = &local_160;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(pSVar1);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_178;
    (pPVar14->sort)._content = (uint64_t)local_180;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_170 == &local_160) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_15f,local_160);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_158;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_170;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_15f,local_160);
    }
    (pPVar14->label)._M_string_length = local_168;
    local_e0 = local_150;
    break;
  case TS_TO_INT:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_00633f20:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,&this->_results);
    aVar8 = local_398;
    aVar9 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar8.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar9.trm = Kernel::AtomicSort::boolSort();
    }
    TVar10 = Kernel::AtomicSort::realSort();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    pSVar4 = DAT_00b521b0;
    if (aVar9.frm != (Formula *)TVar10._content) goto LAB_00633f20;
    pOVar11 = Kernel::Theory::getNonpolymorphicOperatorType(REAL_TO_INT);
    uVar7 = Kernel::Signature::getInterpretingSymbol(pSVar4,REAL_TO_INT,pOVar11);
    aVar8.frm = (Formula *)Kernel::Term::create1(uVar7,aVar8.trm);
    local_148 = (uint64_t)Kernel::AtomicSort::intSort();
    local_140 = false;
    local_130 = 0;
    local_128 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_138 = &local_128;
    local_118.frm = aVar8.frm;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_140;
    (pPVar14->sort)._content = local_148;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_138 == &local_128) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_127,local_128);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_120;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_138;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_127,local_128);
    }
    (pPVar14->label)._M_string_length = local_130;
    local_e0 = local_118;
    break;
  case TS_TO_REAL:
    pPVar14 = (this->_results)._cursor;
    if ((pPVar14 == (this->_results)._stack) ||
       ((((~(uint)pPVar14[-1].sort._content & 3) == 0 && (pPVar14[-1].formula == true)) &&
        (pPVar14[-1].field_3.frm == (Formula *)0x0)))) {
LAB_00633f56:
      local_3c8.frm = (Formula *)&local_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"built-in symbol","");
      complainAboutArgShortageOrWrongSorts(this,(string *)&local_3c8.trm,exp);
    }
    Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)&local_3c8.trm,&this->_results);
    aVar8 = local_398;
    aVar9 = local_3c8;
    if (local_3c0._0_1_ == '\x01') {
      aVar8.frm = (Formula *)Kernel::Term::createFormula(local_398.frm);
      aVar9.trm = Kernel::AtomicSort::boolSort();
    }
    TVar10 = Kernel::AtomicSort::intSort();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_allocated_capacity != &local_3a8) {
      operator_delete((void *)local_3b8._M_allocated_capacity,local_3a8._M_allocated_capacity + 1);
    }
    pSVar4 = DAT_00b521b0;
    if (aVar9.frm != (Formula *)TVar10._content) goto LAB_00633f56;
    pOVar11 = Kernel::Theory::getNonpolymorphicOperatorType(INT_TO_REAL);
    uVar7 = Kernel::Signature::getInterpretingSymbol(pSVar4,INT_TO_REAL,pOVar11);
    aVar8.frm = (Formula *)Kernel::Term::create1(uVar7,aVar8.trm);
    local_110 = (uint64_t)Kernel::AtomicSort::realSort();
    local_108 = false;
    local_f8 = 0;
    local_f0 = '\0';
    pPVar14 = (this->_results)._cursor;
    local_100 = &local_f0;
    local_e0.frm = aVar8.frm;
    if (pPVar14 == (this->_results)._end) {
      Lib::Stack<Parse::SMTLIB2::ParseResult>::expand(&this->_results);
      pPVar14 = (this->_results)._cursor;
    }
    pPVar14->formula = local_108;
    (pPVar14->sort)._content = local_110;
    paVar23 = &(pPVar14->label).field_2;
    (pPVar14->label)._M_dataplus._M_p = (pointer)paVar23;
    if (local_100 == &local_f0) {
      paVar23->_M_allocated_capacity = CONCAT71(uStack_ef,local_f0);
      *(undefined8 *)((long)&(pPVar14->label).field_2 + 8) = uStack_e8;
    }
    else {
      (pPVar14->label)._M_dataplus._M_p = local_100;
      (pPVar14->label).field_2._M_allocated_capacity = CONCAT71(uStack_ef,local_f0);
    }
    (pPVar14->label)._M_string_length = local_f8;
  }
  (pPVar14->field_3).frm = (Formula *)local_e0;
  ppPVar2 = &(this->_results)._cursor;
  *ppPVar2 = *ppPVar2 + 1;
  bVar5 = true;
switchD_00632401_caseD_b:
  return bVar5;
}

Assistant:

bool SMTLIB2::parseAsBuiltinTermSymbol(const std::string& id, LExpr* exp)
{
  // try built-in term symbols
  TermSymbol ts = getBuiltInTermSymbol(id);
  switch(ts) {
    case TS_ITE:
    {
      Formula* cond;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          !(_results.pop().asFormula(cond))) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList thenBranch;
      if (_results.isEmpty() || _results.top().isSeparator()){
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList sort = _results.pop().asTerm(thenBranch);
      TermList elseBranch;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(elseBranch) != sort){
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList res = TermList(Term::createITE(cond, thenBranch, elseBranch, sort));

      _results.push(ParseResult(sort,res));
      return true;
    }
    case TS_TO_REAL:
    {
      TermList theInt;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theInt) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_TO_REAL);
      TermList res = TermList(Term::create1(fun,theInt));

      _results.push(ParseResult(AtomicSort::realSort(),res));
      return true;
    }
    case TS_TO_INT:
    {
      TermList theReal;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theReal) != AtomicSort::realSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::REAL_TO_INT);
      TermList res = TermList(Term::create1(fun,theReal));

      _results.push(ParseResult(AtomicSort::intSort(),res));
      return true;
    }
    case TS_SELECT:
    {
      TermList theArray;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList arraySortIdx = _results.pop().asTerm(theArray);
      if (!arraySortIdx.isArraySort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theIndex;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theIndex) != SortHelper::getIndexSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      if (SortHelper::getInnerSort(arraySortIdx)== AtomicSort::boolSort()) {
        OperatorType* predType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_BOOL_SELECT);
        unsigned pred = env.signature->getInterpretingSymbol(Theory::ARRAY_BOOL_SELECT,predType);

        Formula* res = new AtomicFormula(Literal::create2(pred,true,theArray,theIndex));

        _results.push(ParseResult(res));
      } else {
        OperatorType* funType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_SELECT);
        unsigned fun = env.signature->getInterpretingSymbol(Theory::ARRAY_SELECT,funType);

        TermList res = TermList(Term::create2(fun,theArray,theIndex));

        _results.push(ParseResult(SortHelper::getInnerSort(arraySortIdx),res));
      }

      return true;
    }
    case TS_STORE:
    {
      TermList theArray;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList arraySortIdx = _results.pop().asTerm(theArray);
      if (!arraySortIdx.isArraySort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theIndex;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theIndex) != SortHelper::getIndexSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList theValue;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theValue) != SortHelper::getInnerSort(arraySortIdx)) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      OperatorType* funType = Theory::getArrayOperatorType(arraySortIdx,Theory::ARRAY_STORE);
      unsigned fun = env.signature->getInterpretingSymbol(Theory::ARRAY_STORE,funType);

      TermList args[] = {theArray, theIndex, theValue};
      TermList res = TermList(Term::create(fun, 3, args));

      _results.push(ParseResult(arraySortIdx,res));

      return true;
    }
    case TS_ABS:
    {
      TermList theInt;
      if (_results.isEmpty() || _results.top().isSeparator() ||
          _results.pop().asTerm(theInt) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_ABS);
      TermList res = TermList(Term::create1(fun,theInt));

      _results.push(ParseResult(AtomicSort::intSort(),res));

      return true;
    }
    case TS_MOD:
    {
      TermList int1, int2;
      if (_results.isEmpty() || _results.top().isSeparator() || _results.pop().asTerm(int1) != AtomicSort::intSort() ||
          _results.isEmpty() || _results.top().isSeparator() || _results.pop().asTerm(int2) != AtomicSort::intSort()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      unsigned fun = env.signature->getInterpretingSymbol(Theory::INT_REMAINDER_E); // TS_MOD is the always positive remainder, therefore INT_REMAINDER_E
      TermList res = TermList(Term::create2(fun,int1,int2));

      _results.push(ParseResult(AtomicSort::intSort(),res));

      return true;
    }
    case TS_MULTIPLY:
    case TS_PLUS:
    case TS_MINUS:
    case TS_DIVIDE:
    case TS_DIV:
    {
      // read the first argument
      TermList first;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      TermList sort = _results.pop().asTerm(first);

      if (_results.isEmpty() || _results.top().isSeparator()) {
        if (ts == TS_MINUS) { // unary minus
          Interpretation intp = getUnaryMinusInterpretation(sort);
          unsigned fun = env.signature->getInterpretingSymbol(intp);

          TermList res = TermList(Term::create1(fun,first));

          _results.push(ParseResult(sort,res));

          return true;
        } else {
          complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp); // we need at least two arguments otherwise
        }
      }

      Interpretation intp = getTermSymbolInterpretation(ts,sort);
      unsigned fun = env.signature->getInterpretingSymbol(intp);

      TermList second;
      if (_results.pop().asTerm(second) != sort) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }

      TermList res = TermList(Term::create2(fun,first,second));
      while (_results.isNonEmpty() && !_results.top().isSeparator()) {
        TermList another;
        if (_results.pop().asTerm(another) != sort) {
          complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
        }

        res = TermList(Term::create2(fun,res,another));
      }
      _results.push(ParseResult(sort,res));

      return true;
    }
    case TS_ARRAY:
    {
      TermList indexSort;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      ALWAYS(_results.pop().asTerm(indexSort) == AtomicSort::superSort());
      TermList innerSort;
      if (_results.isEmpty() || _results.top().isSeparator()) {
        complainAboutArgShortageOrWrongSorts(BUILT_IN_SYMBOL,exp);
      }
      ALWAYS(_results.pop().asTerm(innerSort) == AtomicSort::superSort());
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::arraySort(indexSort, innerSort)));
      return true;
    }
    case TS_BOOL:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::boolSort()));
      return true;
    }
    case TS_INT:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::intSort()));
      return true;
    }
    case TS_REAL:
    {
      _results.push(ParseResult(AtomicSort::superSort(),AtomicSort::realSort()));
      return true;
    }
    default:
      ASS_EQ(ts,TS_USER_FUNCTION);
      return false;
  }
}